

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QSet<QGesture_*> operator&(QSet<QGesture_*> *lhs,QSet<QGesture_*> *rhs)

{
  Hash HVar1;
  QHash<QGesture_*,_QHashDummyValue> QVar2;
  Data *in_RDX;
  long in_FS_OFFSET;
  Hash local_38;
  QHash<QGesture_*,_QHashDummyValue> local_30;
  QHash<QGesture_*,_QHashDummyValue> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (rhs->q_hash).d;
  if (local_38.d == (Data *)0x0) {
    if ((Data *)*(Hash *)in_RDX == (Data *)0x0) {
      (lhs->q_hash).d = (Data *)0x0;
      goto LAB_002d7bb5;
    }
LAB_002d7b92:
    QHash<QGesture_*,_QHashDummyValue>::clear(&local_38);
  }
  else {
    if (((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    HVar1.d = *in_RDX;
    if (local_38.d != HVar1.d) {
      if ((((local_38.d == (Data *)0x0) || (HVar1.d == (Data *)0x0)) || ((local_38.d)->size == 0))
         || ((HVar1.d)->size == 0)) goto LAB_002d7b92;
      if ((uint)((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
        local_28.d = in_RDX;
        QtPrivate::
        qset_erase_if<QGesture*,QSet<QGesture*>::intersect(QSet<QGesture*>const&)::_lambda(QGesture*const&)_1_>
                  ((QSet<QGesture_*> *)&local_38,(anon_class_8_1_a86c6e30 *)&local_28);
      }
      else {
        QSet<QGesture_*>::intersected_helper
                  ((QSet<QGesture_*> *)&local_30,(QSet<QGesture_*> *)&local_38,
                   (QSet<QGesture_*> *)in_RDX);
        QVar2.d = local_30.d;
        local_28.d = local_38.d;
        local_30.d = (Data *)0x0;
        local_38.d = QVar2.d;
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_28);
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_30);
      }
    }
  }
  (lhs->q_hash).d = local_38.d;
  if ((local_38.d != (Data *)0x0) &&
     (((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_002d7bb5:
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSet<QGesture_*>)(Hash)lhs;
  }
  __stack_chk_fail();
}

Assistant:

friend QSet operator&(const QSet &lhs, const QSet &rhs) { return QSet(lhs) &= rhs; }